

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::CommitParser::FormatDateTime_abi_cxx11_
          (string *__return_storage_ptr__,CommitParser *this,Person *person)

{
  tm *ptVar1;
  long lVar2;
  char *__format;
  char tz [32];
  time_t seconds;
  char dt [1024];
  
  seconds = person->Time;
  ptVar1 = gmtime(&seconds);
  snprintf(dt,0x400,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
           (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
           (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,dt,(allocator<char> *)tz);
  lVar2 = person->TimeZone;
  if (lVar2 < 0) {
    lVar2 = -lVar2;
    __format = " -%04ld";
  }
  else {
    __format = " +%04ld";
  }
  snprintf(tz,0x20,__format,lVar2);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatDateTime(Person const& person)
  {
    // Convert the time to a human-readable format that is also easy
    // to machine-parse: "CCYY-MM-DD hh:mm:ss".
    time_t seconds = static_cast<time_t>(person.Time);
    struct tm* t = gmtime(&seconds);
    char dt[1024];
    snprintf(dt, sizeof(dt), "%04d-%02d-%02d %02d:%02d:%02d",
             t->tm_year + 1900, t->tm_mon + 1, t->tm_mday, t->tm_hour,
             t->tm_min, t->tm_sec);
    std::string out = dt;

    // Add the time-zone field "+zone" or "-zone".
    char tz[32];
    if (person.TimeZone >= 0) {
      snprintf(tz, sizeof(tz), " +%04ld", person.TimeZone);
    } else {
      snprintf(tz, sizeof(tz), " -%04ld", -person.TimeZone);
    }
    out += tz;
    return out;
  }